

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O1

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Int64(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
        *this,int64_t i)

{
  int64_t *piVar1;
  ushort uVar2;
  
  if ((long)(this->stack_).stackEnd_ - (long)(this->stack_).stackTop_ < 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (&this->stack_,1);
  }
  piVar1 = (int64_t *)(this->stack_).stackTop_;
  (this->stack_).stackTop_ = (char *)(piVar1 + 2);
  *piVar1 = 0;
  piVar1[1] = 0;
  *piVar1 = i;
  *(undefined2 *)((long)piVar1 + 0xe) = 0x96;
  if (i < 0) {
    uVar2 = 0xb6;
    if (i < -0x80000000) {
      return true;
    }
  }
  else {
    uVar2 = (ushort)((ulong)i >> 0x20 == 0) << 6;
    *(ushort *)((long)piVar1 + 0xe) = uVar2 | 0x196;
    if (0x7fffffff < (ulong)i) {
      return true;
    }
    uVar2 = uVar2 | 0x1b6;
  }
  *(ushort *)((long)piVar1 + 0xe) = uVar2;
  return true;
}

Assistant:

bool Int64(int64_t i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }